

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene.cpp
# Opt level: O0

void __thiscall CMU462::DynamicScene::Scene::render_in_opengl(Scene *this)

{
  SceneObject *pSVar1;
  bool bVar2;
  reference ppSVar3;
  _Rb_tree_const_iterator<CMU462::DynamicScene::SceneObject_*> *in_RDI;
  SceneObject *obj_1;
  iterator __end2_1;
  iterator __begin2_1;
  set<CMU462::DynamicScene::SceneObject_*,_std::less<CMU462::DynamicScene::SceneObject_*>,_std::allocator<CMU462::DynamicScene::SceneObject_*>_>
  *__range2_1;
  SceneObject *obj;
  iterator __end2;
  iterator __begin2;
  set<CMU462::DynamicScene::SceneObject_*,_std::less<CMU462::DynamicScene::SceneObject_*>,_std::allocator<CMU462::DynamicScene::SceneObject_*>_>
  *__range2;
  set<CMU462::DynamicScene::SceneObject_*,_std::less<CMU462::DynamicScene::SceneObject_*>,_std::allocator<CMU462::DynamicScene::SceneObject_*>_>
  *in_stack_ffffffffffffffa8;
  _Self local_40;
  _Self local_38;
  _Rb_tree_const_iterator<CMU462::DynamicScene::SceneObject_*> *local_30;
  SceneObject *local_28;
  _Self local_20;
  _Self local_18;
  _Rb_tree_const_iterator<CMU462::DynamicScene::SceneObject_*> *local_10;
  
  local_10 = in_RDI + 0x13;
  local_18._M_node =
       (_Base_ptr)
       std::
       set<CMU462::DynamicScene::SceneObject_*,_std::less<CMU462::DynamicScene::SceneObject_*>,_std::allocator<CMU462::DynamicScene::SceneObject_*>_>
       ::begin(in_stack_ffffffffffffffa8);
  local_20._M_node =
       (_Base_ptr)
       std::
       set<CMU462::DynamicScene::SceneObject_*,_std::less<CMU462::DynamicScene::SceneObject_*>,_std::allocator<CMU462::DynamicScene::SceneObject_*>_>
       ::end(in_stack_ffffffffffffffa8);
  while( true ) {
    bVar2 = std::operator!=(&local_18,&local_20);
    if (!bVar2) break;
    ppSVar3 = std::_Rb_tree_const_iterator<CMU462::DynamicScene::SceneObject_*>::operator*(in_RDI);
    local_28 = *ppSVar3;
    if (((local_28->isVisible & 1U) != 0) && ((local_28->isGhosted & 1U) == 0)) {
      (*local_28->_vptr_SceneObject[1])();
    }
    std::_Rb_tree_const_iterator<CMU462::DynamicScene::SceneObject_*>::operator++(in_RDI);
  }
  local_30 = in_RDI + 0x13;
  local_38._M_node =
       (_Base_ptr)
       std::
       set<CMU462::DynamicScene::SceneObject_*,_std::less<CMU462::DynamicScene::SceneObject_*>,_std::allocator<CMU462::DynamicScene::SceneObject_*>_>
       ::begin(in_stack_ffffffffffffffa8);
  local_40._M_node =
       (_Base_ptr)
       std::
       set<CMU462::DynamicScene::SceneObject_*,_std::less<CMU462::DynamicScene::SceneObject_*>,_std::allocator<CMU462::DynamicScene::SceneObject_*>_>
       ::end(in_stack_ffffffffffffffa8);
  while( true ) {
    bVar2 = std::operator!=(&local_38,&local_40);
    if (!bVar2) break;
    ppSVar3 = std::_Rb_tree_const_iterator<CMU462::DynamicScene::SceneObject_*>::operator*(in_RDI);
    pSVar1 = *ppSVar3;
    if (((pSVar1->isVisible & 1U) != 0) && ((pSVar1->isGhosted & 1U) != 0)) {
      (*pSVar1->_vptr_SceneObject[3])();
    }
    std::_Rb_tree_const_iterator<CMU462::DynamicScene::SceneObject_*>::operator++(in_RDI);
  }
  return;
}

Assistant:

void Scene::render_in_opengl() {
  for (SceneObject *obj : objects) {
    if (obj->isVisible && !obj->isGhosted) {
      obj->draw();
    }
  }

  for (SceneObject *obj : objects) {
    if (obj->isVisible && obj->isGhosted) {
      obj->drawGhost();
    }
  }
}